

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_inspect(REF_ADJ ref_adj)

{
  ulong uVar1;
  
  printf("ref_adj = %p\n",ref_adj);
  printf(" blank = %d\n",(ulong)(uint)ref_adj->blank);
  if (0 < ref_adj->nnode) {
    uVar1 = 0;
    do {
      printf(" first[%d] = %d\n",uVar1 & 0xffffffff,(ulong)(uint)ref_adj->first[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)ref_adj->nnode);
  }
  if (0 < ref_adj->nitem) {
    uVar1 = 0;
    do {
      printf(" item[%d] = %d : %d\n",uVar1 & 0xffffffff,(ulong)(uint)ref_adj->item[uVar1].next,
             (ulong)(uint)ref_adj->item[uVar1].ref);
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)ref_adj->nitem);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_inspect(REF_ADJ ref_adj) {
  REF_INT node, item;
  printf("ref_adj = %p\n", (void *)ref_adj);
  printf(" blank = %d\n", ref_adj->blank);
  for (node = 0; node < ref_adj_nnode(ref_adj); node++)
    printf(" first[%d] = %d\n", node, ref_adj->first[node]);
  for (item = 0; item < ref_adj_nitem(ref_adj); item++)
    printf(" item[%d] = %d : %d\n", item, ref_adj->item[item].next,
           ref_adj->item[item].ref);

  return REF_SUCCESS;
}